

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

void mcpl_repair(char *filename)

{
  uint64_t n;
  uint64_t uVar1;
  mcpl_fileinternal_t *f;
  mcpl_file_t mVar2;
  FILE *__stream;
  char *pcVar3;
  int repair_status;
  mcu8str f_2;
  int local_34;
  mcu8str local_30;
  
  local_34 = 1;
  mVar2 = mcpl_actual_open_file(filename,&local_34);
  n = *(uint64_t *)((long)mVar2.internal + 0x40);
  mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar2.internal);
  if (local_34 == 2) {
    pcVar3 = "File must be gunzipped before it can be checked and possibly repaired.";
  }
  else if (local_34 == 1) {
    pcVar3 = "Input file is indeed broken, but must be gunzipped before it can be repaired.";
  }
  else if (local_34 == 0) {
    pcVar3 = "File does not appear to be broken.";
  }
  else {
    mcu8str_view_cstr(&local_30,filename);
    __stream = (FILE *)mctools_fopen(&local_30,"r+b");
    if (__stream == (FILE *)0x0) {
      pcVar3 = "Unable to open file in update mode!";
    }
    else {
      mcpl_update_nparticles((FILE *)__stream,n);
      fclose(__stream);
      local_34 = 1;
      mVar2 = mcpl_actual_open_file(filename,&local_34);
      uVar1 = *(uint64_t *)((long)mVar2.internal + 0x40);
      mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar2.internal);
      if ((local_34 == 0) && (n == uVar1)) {
        printf("MCPL: Successfully repaired file with %lu particles.\n",n);
        return;
      }
      pcVar3 = "Something went wrong while attempting to repair file.";
    }
  }
  (*mcpl_error_handler)(pcVar3);
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

void mcpl_repair(const char * filename)
{
  int repair_status = 1;
  mcpl_file_t f = mcpl_actual_open_file(filename,&repair_status);
  uint64_t nparticles = mcpl_hdr_nparticles(f);
  mcpl_close_file(f);
  if (repair_status==0) {
    mcpl_error("File does not appear to be broken.");
  } else if (repair_status==1) {
    mcpl_error("Input file is indeed broken, but must be gunzipped before it can be repaired.");
  } else if (repair_status==2) {
    mcpl_error("File must be gunzipped before it can be checked and possibly repaired.");
  }
  //Ok, we should repair the file by updating nparticles in the header:
  FILE * fh = mcpl_internal_fopen(filename,"r+b");
  if (!fh)
    mcpl_error("Unable to open file in update mode!");
  mcpl_update_nparticles(fh, nparticles);
  fclose(fh);
  //Verify that we fixed it:
  repair_status = 1;
  f = mcpl_actual_open_file(filename,&repair_status);
  uint64_t nparticles2 = mcpl_hdr_nparticles(f);
  mcpl_close_file(f);
  if (repair_status==0&&nparticles==nparticles2) {
    printf("MCPL: Successfully repaired file with %" PRIu64 " particles.\n",nparticles);
  } else {
    mcpl_error("Something went wrong while attempting to repair file.");
  }
}